

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

bool __thiscall Parser::checkExpFuncDefinition(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  TokenizerPosition start;
  pointer pCVar3;
  bool bVar4;
  Token *token;
  Token *pTVar5;
  ExpressionFunctionHandler *pEVar6;
  iterator end;
  char *text;
  iterator this_00;
  optional<ExpressionFunctionHandle> oVar7;
  Identifier functionName;
  vector<Identifier,_std::allocator<Identifier>_> functionParameters;
  vector<Token,_std::allocator<Token>_> functionContent;
  Identifier local_78;
  vector<Identifier,_std::allocator<Identifier>_> local_58;
  vector<Token,_std::allocator<Token>_> local_40;
  
  token = Tokenizer::peekToken
                    ((this->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (token->type != Identifier) {
    return false;
  }
  if (*(__index_type *)
       ((long)&(token->value).
               super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
       + 0x20) != '\x04') {
    __assert_fail("std::holds_alternative<Identifier>(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                  ,0x4d,"const Identifier &Token::identifierValue() const");
  }
  plVar2 = *(long **)&(token->value).
                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      ._M_u;
  if ((char)*plVar2 != '.') {
    return false;
  }
  if (*(long *)((long)&(token->value).
                       super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                       super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
               + 8) != 8) {
    return false;
  }
  if (*plVar2 != 0x636e75667078652e) {
    return false;
  }
  Tokenizer::eatTokens
            ((this->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer,1);
  paVar1 = &local_78._name.field_2;
  local_78._name._M_string_length = 0;
  local_78._name.field_2._M_local_buf[0] = '\0';
  local_58.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._name._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = parseFunctionDeclaration(this,&local_78,&local_58);
  if ((!bVar4) ||
     (pTVar5 = Tokenizer::nextToken
                         ((this->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer),
     pTVar5->type != Comma)) {
    printError<>(this,token,"Invalid expression function declaration");
    bVar4 = false;
    goto LAB_00146880;
  }
  start.it._M_node =
       (iterator)
       (((this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node;
  while( true ) {
    this_00._M_node =
         (_List_node_base *)
         (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
    end._M_node = (((TokenizerPosition *)((long)(this_00._M_node + 1) + 8))->it)._M_node;
    if (end._M_node == this_00._M_node) break;
    pTVar5 = Tokenizer::peekToken((Tokenizer *)this_00._M_node,0);
    this_00._M_node =
         (_List_node_base *)
         (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
    if (pTVar5->type == Separator) {
      end._M_node = (((Tokenizer *)this_00._M_node)->position).it._M_node;
      break;
    }
    Tokenizer::eatTokens((Tokenizer *)this_00._M_node,1);
  }
  Tokenizer::getTokens(&local_40,(Tokenizer *)this_00._M_node,start,(TokenizerPosition)end._M_node);
  pCVar3 = (this->conditionStack).
           super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pCVar3[-1].inUnknownBlock == false) {
    bVar4 = true;
    if (pCVar3[-1].inTrueBlock == true) {
      pTVar5 = Tokenizer::nextToken
                         ((this->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
      if (pTVar5->type != Separator) {
        text = ".expfunc directive not terminated";
        goto LAB_001467fc;
      }
      pEVar6 = ExpressionFunctionHandler::instance();
      oVar7 = ExpressionFunctionHandler::find(pEVar6,&local_78);
      if (((undefined1  [16])
           oVar7.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
           super__Optional_payload_base<ExpressionFunctionHandle> & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0) {
        pEVar6 = ExpressionFunctionHandler::instance();
        ExpressionFunctionHandler::addUserFunction(pEVar6,&local_78,&local_58,&local_40);
        goto LAB_00146876;
      }
      printError<Identifier>(this,token,"Expression function \"%s\" already declared",&local_78);
      goto LAB_00146807;
    }
  }
  else {
    text = "Expression function definition not allowed inside of block with non-trivial condition";
LAB_001467fc:
    printError<>(this,token,text);
LAB_00146807:
    bVar4 = false;
  }
LAB_00146876:
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_40);
LAB_00146880:
  std::vector<Identifier,_std::allocator<Identifier>_>::~vector(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._name._M_dataplus._M_p,
                    CONCAT71(local_78._name.field_2._M_allocated_capacity._1_7_,
                             local_78._name.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool Parser::checkExpFuncDefinition()
{
	const Token& first = peekToken();
	if (first.type != TokenType::Identifier)
		return false;

	const auto &identifier = first.identifierValue();
	if (!identifier.startsWith('.') || first.identifierValue() != ".expfunc")
		return false;

	eatToken();

	Identifier functionName;
	std::vector<Identifier> functionParameters;

	// load declarationn
	if (!parseFunctionDeclaration(functionName, functionParameters))
	{
		printError(first, "Invalid expression function declaration");
		return false;
	}

	if (nextToken().type != TokenType::Comma)
	{
		printError(first, "Invalid expression function declaration");
		return false;
	}

	// load definition
	TokenizerPosition start = getTokenizer()->getPosition();

	while (!atEnd() && peekToken().type != TokenType::Separator)
		eatToken();

	TokenizerPosition end = getTokenizer()->getPosition();
	auto functionContent = getTokenizer()->getTokens(start,end);

	// checks

	// Expression functions have to be defined at parse time, so they can't be defined in blocks
	// with non-trivial conditions
	if (isInsideUnknownBlock())
	{
		printError(first, "Expression function definition not allowed inside of block with non-trivial condition");
		return false;
	}

	// if we are in a known false block, don't define the function
	if (!isInsideTrueBlock())
		return true;

	if(nextToken().type != TokenType::Separator)
	{
		printError(first, ".expfunc directive not terminated");
		return false;
	}

	// duplicate check
	if (ExpressionFunctionHandler::instance().find(functionName))
	{
		printError(first, "Expression function \"%s\" already declared", functionName);
		return false;
	}

	// register function
	ExpressionFunctionHandler::instance().addUserFunction(functionName, functionParameters, functionContent);
	return true;
}